

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false>_>
::Matrix(Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false>_>
         *this,function<bool_(unsigned_int,_unsigned_int)> *birthComparator,
        function<bool_(unsigned_int,_unsigned_int)> *deathComparator)

{
  Column_z2_settings *this_00;
  function<bool_(unsigned_int,_unsigned_int)> *deathComparator_local;
  function<bool_(unsigned_int,_unsigned_int)> *birthComparator_local;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false>_>
  *this_local;
  
  this_00 = (Column_z2_settings *)operator_new(0x38);
  Column_z2_settings::Column_z2_settings(this_00);
  this->colSettings_ = this_00;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false>>>
  ::
  Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,false,false,false>>>
              *)&this->matrix_,this->colSettings_,birthComparator,deathComparator);
  _assert_options();
  return;
}

Assistant:

inline Matrix<PersistenceMatrixOptions>::Matrix(const std::function<bool(Pos_index,Pos_index)>& birthComparator,
                                                const std::function<bool(Pos_index,Pos_index)>& deathComparator)
    : colSettings_(new Column_settings()),
      matrix_(colSettings_, birthComparator, deathComparator)
{
  static_assert(
      !PersistenceMatrixOptions::is_of_boundary_type && PersistenceMatrixOptions::has_vine_update &&
          !PersistenceMatrixOptions::has_column_pairings,
      "Constructor only available for chain matrices when vine swaps are enabled, but the barcode is not recorded.");
  _assert_options();
}